

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O3

uint32_t * prf_vertex_list_get_list_ptr(prf_node_t *node)

{
  uint32_t *puVar1;
  
  if (node->opcode == prf_vertex_list_info.opcode) {
    puVar1 = (uint32_t *)node->data;
  }
  else {
    puVar1 = (uint32_t *)0x0;
    prf_error(9,"tried vertex_list_get_list_ptr() on node of type %d.");
  }
  return puVar1;
}

Assistant:

uint32_t *
prf_vertex_list_get_list_ptr(
    prf_node_t * node )
{
    assert( node != NULL );

    if ( node->opcode != prf_vertex_list_info.opcode ) {
        prf_error( 9, "tried vertex_list_get_list_ptr() on node of type %d.",
            node->opcode );
        return NULL;
    }

    return (uint32_t *) node->data;
}